

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learner.h
# Opt level: O0

void LEARNER::multiline_learn_or_predict<true>
               (multi_learner *base,multi_ex *examples,uint64_t offset,uint32_t id)

{
  bool bVar1;
  vector<example_*,_std::allocator<example_*>_> *ec_00;
  reference ppeVar2;
  size_type sVar3;
  reference pvVar4;
  reference ppeVar5;
  uint64_t in_RDX;
  vector<example_*,_std::allocator<example_*>_> *in_RSI;
  size_t i;
  example *ec;
  iterator __end2;
  iterator __begin2;
  multi_ex *__range2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> saved_offsets;
  vector<example_*,_std::allocator<example_*>_> *in_stack_ffffffffffffff68;
  value_type vVar6;
  __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
  *in_stack_ffffffffffffff70;
  allocator_type *__a;
  size_type in_stack_ffffffffffffff88;
  ulong uVar7;
  ulong __n;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff90;
  example *peVar8;
  __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_> local_60;
  vector<example_*,_std::allocator<example_*>_> *local_58;
  allocator_type local_39;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_38;
  uint64_t local_18;
  vector<example_*,_std::allocator<example_*>_> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  ec_00 = (vector<example_*,_std::allocator<example_*>_> *)
          std::vector<example_*,_std::allocator<example_*>_>::size(in_RSI);
  __a = &local_39;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x2a0744);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,__a);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x2a0764);
  local_58 = local_10;
  local_60._M_current =
       (example **)
       std::vector<example_*,_std::allocator<example_*>_>::begin(in_stack_ffffffffffffff68);
  std::vector<example_*,_std::allocator<example_*>_>::end(in_stack_ffffffffffffff68);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff70,
                       (__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                        *)in_stack_ffffffffffffff68);
    if (!bVar1) break;
    ppeVar2 = __gnu_cxx::
              __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>::
              operator*(&local_60);
    peVar8 = *ppeVar2;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)__a,
               (value_type_conflict3 *)ec_00);
    (peVar8->super_example_predict).ft_offset = local_18;
    __gnu_cxx::__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>::
    operator++(&local_60);
  }
  learner<char,_std::vector<example_*,_std::allocator<example_*>_>_>::learn
            ((learner<char,_std::vector<example_*,_std::allocator<example_*>_>_> *)__a,ec_00,
             (size_t)in_stack_ffffffffffffff70);
  uVar7 = 0;
  while( true ) {
    __n = uVar7;
    sVar3 = std::vector<example_*,_std::allocator<example_*>_>::size(local_10);
    if (sVar3 <= uVar7) break;
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](&local_38,__n);
    vVar6 = *pvVar4;
    ppeVar5 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_10,__n);
    ((*ppeVar5)->super_example_predict).ft_offset = vVar6;
    uVar7 = __n + 1;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)__a);
  return;
}

Assistant:

void multiline_learn_or_predict(multi_learner& base, multi_ex& examples, const uint64_t offset, const uint32_t id = 0)
{
  std::vector<uint64_t> saved_offsets(examples.size());
  for (auto ec : examples)
  {
    saved_offsets.push_back(ec->ft_offset);
    ec->ft_offset = offset;
  }

  if (is_learn)
    base.learn(examples, id);
  else
    base.predict(examples, id);

  for (size_t i = 0; i < examples.size(); i++) examples[i]->ft_offset = saved_offsets[i];
}